

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneI.cpp
# Opt level: O0

unsigned_short __thiscall PermutazioneI::lisLength(PermutazioneI *this,PermutazioneI *p)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  unsigned_short *l_00;
  unsigned_short *q_00;
  unsigned_short *q;
  unsigned_short *l;
  int imax;
  unsigned_short llis;
  PermutazioneI *p_local;
  PermutazioneI *this_local;
  
  auVar1 = ZEXT216((p->super_Permutazione).dimensione) * ZEXT816(2);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  _imax = p;
  p_local = this;
  l_00 = (unsigned_short *)operator_new__(uVar2);
  auVar1 = ZEXT216((_imax->super_Permutazione).dimensione) * ZEXT816(2);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  q_00 = (unsigned_short *)operator_new__(uVar2);
  createLengthsArray(this,_imax,l_00,q_00,(unsigned_short *)((long)&l + 6),(int *)&l);
  if (l_00 != (unsigned_short *)0x0) {
    operator_delete__(l_00);
  }
  if (q_00 != (unsigned_short *)0x0) {
    operator_delete__(q_00);
  }
  return l._6_2_;
}

Assistant:

unsigned short PermutazioneI::lisLength(PermutazioneI* p) {
	unsigned short llis;
	int  imax;

	unsigned short* l = new unsigned short[p->dimensione];
	unsigned short* q = new unsigned short[p->dimensione];

	createLengthsArray(p, l, q, llis, imax);

	delete[] l;
	delete[] q;
	return llis;
}